

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O3

void UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  long *plVar4;
  UChar *pUVar5;
  byte *pbVar6;
  int8_t iVar7;
  uint uVar8;
  UConverter *pUVar9;
  byte *pbVar10;
  uint8_t uVar11;
  short sVar12;
  byte *pbVar14;
  int iVar15;
  ulong uVar16;
  char tempBuf [2];
  ushort local_4a;
  UErrorCode *local_48;
  UChar *local_40;
  UConverterToUnicodeArgs *local_38;
  uint uVar13;
  
  pUVar9 = args->converter;
  pbVar14 = (byte *)args->source;
  local_40 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  plVar4 = (long *)pUVar9->extraInfo;
  local_48 = err;
  local_38 = args;
  if (pbVar14 < pbVar3) {
LAB_0016cdb8:
    pUVar5 = local_38->targetLimit;
    uVar16 = (ulong)pbVar14 & 0xffffffff;
    pbVar6 = pbVar14;
    do {
      pbVar10 = pbVar6;
      args = local_38;
      if (pUVar5 <= local_40) {
        *local_48 = U_BUFFER_OVERFLOW_ERROR;
        break;
      }
      bVar1 = *pbVar10;
      uVar13 = (uint)bVar1;
      iVar15 = (int)uVar16;
      if (pUVar9->mode == 0x7e) {
        pUVar9->mode = 0;
        if (bVar1 < 0x7d) {
          if (uVar13 != 10) {
            if (uVar13 == 0x7b) goto LAB_0016ce32;
LAB_0016cfa3:
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            *local_48 = U_ILLEGAL_ESCAPE_SEQUENCE;
            pUVar9->toUBytes[0] = '~';
            if (*(char *)((long)plVar4 + 0x11) == '\0') {
              iVar7 = '\x01';
              pbVar14 = pbVar10;
              if ((char)bVar1 < '\0') goto LAB_0016cfc1;
            }
            else {
              iVar7 = '\x01';
              pbVar14 = pbVar10;
              if (0x5d < (byte)(bVar1 - 0x21)) {
LAB_0016cfc1:
                local_38->converter->toUBytes[1] = bVar1;
                iVar7 = '\x02';
                pbVar14 = pbVar10 + 1;
              }
            }
            local_38->converter->toULength = iVar7;
            break;
          }
        }
        else {
          if (bVar1 != 0x7d) {
            if (uVar13 != 0x7e) goto LAB_0016cfa3;
            if (local_38->offsets != (int32_t *)0x0) {
              *(uint *)((long)local_38->offsets + ((long)local_40 - (long)local_38->target) * 2) =
                   ~*(uint *)&local_38->source + iVar15;
            }
            *local_40 = L'~';
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            goto LAB_0016cf44;
          }
LAB_0016ce32:
          *(bool *)((long)plVar4 + 0x11) = bVar1 == 0x7b;
          if (*(char *)((long)plVar4 + 0x13) != '\0') {
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            *local_48 = U_ILLEGAL_ESCAPE_SEQUENCE;
            pUVar9->toUCallbackReason = UCNV_IRREGULAR;
            pUVar9->toUBytes[0] = '~';
            local_38->converter->toUBytes[1] = bVar1;
            goto LAB_0016cf7e;
          }
          *(undefined1 *)((long)plVar4 + 0x13) = 1;
        }
      }
      else {
        if (*(char *)((long)plVar4 + 0x11) == '\0') {
          if (bVar1 != 0x7e) goto LAB_0016cf12;
        }
        else {
          uVar2 = pUVar9->toUnicodeStatus;
          if (uVar2 != 0) {
            uVar11 = (uint8_t)uVar2;
            if (((uVar2 + 0xdf & 0xff) < 0x5d) && ((byte)(bVar1 - 0x21) < 0x5e)) {
              local_4a = CONCAT11(bVar1,uVar11 + 0x80) | 0x8000;
              uVar8 = ucnv_MBCSSimpleGetNextUChar_63
                                (*(UConverterSharedData **)(*plVar4 + 0x30),(char *)&local_4a,2,
                                 pUVar9->useFallback);
              pUVar9 = local_38->converter;
              pUVar9->toUnicodeStatus = 0;
              if ((int)uVar8 < 0xfffe) goto LAB_0016cf20;
              uVar13 = uVar13 | (uVar2 & 0xff) << 8;
              sVar12 = (short)uVar13;
              *local_48 = (uint)(uVar8 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
              if ((uVar2 & 0xff) == 0) goto LAB_0016d02b;
            }
            else {
              pUVar9->toUnicodeStatus = 0;
              *local_48 = U_ILLEGAL_CHAR_FOUND;
              pbVar14 = pbVar10;
              if ((byte)(bVar1 - 0x21) < 0x5e) goto LAB_0016d02e;
              sVar12 = (ushort)bVar1 + (short)uVar2 * 0x100;
            }
            pUVar9->toUBytes[0] = (uint8_t)((ushort)sVar12 >> 8);
            local_38->converter->toUBytes[1] = (uint8_t)sVar12;
LAB_0016cf7e:
            local_38->converter->toULength = '\x02';
            args = local_38;
            goto LAB_0016cf86;
          }
          if (bVar1 != 0x7e) {
            pUVar9->toUnicodeStatus = uVar13 | 0x100;
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            goto LAB_0016ce47;
          }
        }
        pUVar9->mode = 0x7e;
      }
LAB_0016ce47:
      uVar16 = (ulong)(iVar15 + 1);
      pbVar6 = pbVar10 + 1;
      if (pbVar3 <= pbVar10 + 1) goto LAB_0016cf86;
    } while( true );
  }
LAB_0016cf8c:
  args->target = local_40;
  args->source = (char *)pbVar14;
  return;
LAB_0016cf12:
  *(undefined1 *)((long)plVar4 + 0x13) = 0;
  uVar8 = uVar13;
  if ((char)bVar1 < '\0') {
    *local_48 = U_ILLEGAL_CHAR_FOUND;
LAB_0016d02b:
    uVar11 = (uint8_t)uVar13;
    pbVar14 = pbVar10 + 1;
LAB_0016d02e:
    pUVar9->toUBytes[0] = uVar11;
    local_38->converter->toULength = '\x01';
    args = local_38;
    goto LAB_0016cf8c;
  }
LAB_0016cf20:
  if (local_38->offsets != (int32_t *)0x0) {
    *(int *)((long)local_38->offsets + ((long)local_40 - (long)local_38->target) * 2) =
         iVar15 - ((int)*(char *)((long)plVar4 + 0x11) + *(int *)&local_38->source);
  }
  *local_40 = (UChar)uVar8;
LAB_0016cf44:
  local_40 = local_40 + 1;
  pbVar14 = pbVar10 + 1;
  args = local_38;
  if (pbVar3 <= pbVar14) goto LAB_0016cf86;
  goto LAB_0016cdb8;
LAB_0016cf86:
  pbVar14 = pbVar10 + 1;
  goto LAB_0016cf8c;
}

Assistant:

static void  U_CALLCONV
UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    int32_t mySourceChar = 0x0000;
    UConverterDataHZ* myData=(UConverterDataHZ*)(args->converter->extraInfo);
    tempBuf[0]=0; 
    tempBuf[1]=0;

    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < args->target) || (mySourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    
    while(mySource< mySourceLimit){
        
        if(myTarget < args->targetLimit){
            
            mySourceChar= (unsigned char) *mySource++;

            if(args->converter->mode == UCNV_TILDE) {
                /* second byte after ~ */
                args->converter->mode=0;
                switch(mySourceChar) {
                case 0x0A:
                    /* no output for ~\n (line-continuation marker) */
                    continue;
                case UCNV_TILDE:
                    if(args->offsets) {
                        args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 2);
                    }
                    *(myTarget++)=(UChar)mySourceChar;
                    myData->isEmptySegment = FALSE;
                    continue;
                case UCNV_OPEN_BRACE:
                case UCNV_CLOSE_BRACE:
                    myData->isStateDBCS = (mySourceChar == UCNV_OPEN_BRACE);
                    if (myData->isEmptySegment) {
                        myData->isEmptySegment = FALSE; /* we are handling it, reset to avoid future spurious errors */
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toUBytes[0] = UCNV_TILDE;
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                        args->target = myTarget;
                        args->source = mySource;
                        return;
                    }
                    myData->isEmptySegment = TRUE;
                    continue;
                default:
                     /* if the first byte is equal to TILDE and the trail byte
                     * is not a valid byte then it is an error condition
                     */
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     */
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUBytes[0] = UCNV_TILDE;
                    if( myData->isStateDBCS ?
                            (0x21 <= mySourceChar && mySourceChar <= 0x7e) :
                            mySourceChar <= 0x7f
                    ) {
                        /* The current byte could be the start of a character: Back it out. */
                        args->converter->toULength = 1;
                        --mySource;
                    } else {
                        /* Include the current byte in the illegal sequence. */
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                    }
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
            } else if(myData->isStateDBCS) {
                if(args->converter->toUnicodeStatus == 0x00){
                    /* lead byte */
                    if(mySourceChar == UCNV_TILDE) {
                        args->converter->mode = UCNV_TILDE;
                    } else {
                        /* add another bit to distinguish a 0 byte from not having seen a lead byte */
                        args->converter->toUnicodeStatus = (uint32_t) (mySourceChar | 0x100);
                        myData->isEmptySegment = FALSE; /* the segment has something, either valid or will produce a different error, so reset this */
                    }
                    continue;
                }
                else{
                    /* trail byte */
                    int leadIsOk, trailIsOk;
                    uint32_t leadByte = args->converter->toUnicodeStatus & 0xff;
                    targetUniChar = 0xffff;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In HZ DBCS, if the second byte is in the 21..7e range,
                     * we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(leadByte - 0x21) <= (0x7d - 0x21);
                    trailIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        tempBuf[0] = (char) (leadByte+0x80) ;
                        tempBuf[1] = (char) (mySourceChar+0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(myData->gbConverter->sharedData,
                            tempBuf, 2, args->converter->useFallback);
                        mySourceChar= (leadByte << 8) | mySourceChar;
                    } else if (trailIsOk) {
                        /* report a single illegal byte and continue with the following DBCS starter byte */
                        --mySource;
                        mySourceChar = (int32_t)leadByte;
                    } else {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar= 0x10000 | (leadByte << 8) | mySourceChar;
                    }
                    args->converter->toUnicodeStatus =0x00;
                }
            }
            else{
                if(mySourceChar == UCNV_TILDE) {
                    args->converter->mode = UCNV_TILDE;
                    continue;
                } else if(mySourceChar <= 0x7f) {
                    targetUniChar = (UChar)mySourceChar;  /* ASCII */
                    myData->isEmptySegment = FALSE; /* the segment has something valid */
                } else {
                    targetUniChar = 0xffff;
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                }
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 1-(myData->isStateDBCS));
                }

                *(myTarget++)=(UChar)targetUniChar;
            }
            else /* targetUniChar>=0xfffe */ {
                if(targetUniChar == 0xfffe){
                    *err = U_INVALID_CHAR_FOUND;
                }
                else{
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                if(mySourceChar > 0xff){
                    args->converter->toUBytes[0] = (uint8_t)(mySourceChar >> 8);
                    args->converter->toUBytes[1] = (uint8_t)mySourceChar;
                    args->converter->toULength=2;
                }
                else{
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength=1;
                }
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    args->target = myTarget;
    args->source = mySource;
}